

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int File::unlink(char *__name)

{
  int iVar1;
  char *__name_00;
  String *file_local;
  
  __name_00 = String::operator_cast_to_char_((String *)__name);
  iVar1 = ::unlink(__name_00);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool File::unlink(const String& file)
{
#ifdef _WIN32
  if(!DeleteFile(file))
    return false;
#else
  if(::unlink(file) != 0)
    return false;
#endif
  return true;
}